

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O2

void __thiscall ThreadedReplayer::~ThreadedReplayer(ThreadedReplayer *this)

{
  unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_> *this_00;
  long lVar1;
  __node_base *p_Var2;
  __node_base *p_Var3;
  __node_base *p_Var4;
  __node_base *p_Var5;
  anon_class_8_1_8991fb9c local_38;
  
  (this->super_StateCreatorInterface)._vptr_StateCreatorInterface =
       (_func_int **)&PTR__ThreadedReplayer_002a12c0;
  tear_down_threads(this);
  flush_pipeline_cache(this);
  flush_validation_cache(this);
  p_Var2 = &(this->samplers)._M_h._M_before_begin;
  this_00 = &this->device;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    if (*(VkSampler *)&((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor != (VkSampler)0x0)
    {
      (*vkDestroySampler)(((this_00->_M_t).
                           super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                           .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->
                          device,*(VkSampler *)
                                  &((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor,
                          (VkAllocationCallbacks *)0x0);
    }
  }
  p_Var3 = &(this->layouts)._M_h._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    if (*(VkDescriptorSetLayout *)&((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor !=
        (VkDescriptorSetLayout)0x0) {
      (*vkDestroyDescriptorSetLayout)
                (((this_00->_M_t).
                  super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                  .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->device,
                 *(VkDescriptorSetLayout *)
                  &((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor,
                 (VkAllocationCallbacks *)0x0);
    }
  }
  p_Var4 = &(this->pipeline_layouts)._M_h._M_before_begin;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    if (*(VkPipelineLayout *)&((_Prime_rehash_policy *)(p_Var4 + 2))->_M_max_load_factor !=
        (VkPipelineLayout)0x0) {
      (*vkDestroyPipelineLayout)
                (((this_00->_M_t).
                  super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                  .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->device,
                 *(VkPipelineLayout *)&((_Prime_rehash_policy *)(p_Var4 + 2))->_M_max_load_factor,
                 (VkAllocationCallbacks *)0x0);
    }
  }
  p_Var5 = &(this->render_passes)._M_h._M_before_begin;
  while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
    if (*(VkRenderPass *)&((_Prime_rehash_policy *)(p_Var5 + 2))->_M_max_load_factor !=
        (VkRenderPass)0x0) {
      (*vkDestroyRenderPass)
                (((this_00->_M_t).
                  super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                  .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->device,
                 *(VkRenderPass *)&((_Prime_rehash_policy *)(p_Var5 + 2))->_M_max_load_factor,
                 (VkAllocationCallbacks *)0x0);
    }
  }
  free_pipelines(this);
  local_38.this = this;
  Fossilize::ObjectCache<VkShaderModule_T*>::
  delete_cache<ThreadedReplayer::~ThreadedReplayer()::_lambda(unsigned_long,VkShaderModule_T*)_1_>
            ((ObjectCache<VkShaderModule_T*> *)&this->shader_modules,&local_38);
  std::unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>::
  ~unique_ptr(this_00);
  lVar1 = 0;
  do {
    std::
    _Vector_base<ThreadedReplayer::DeferredRayTracingInfo,_std::allocator<ThreadedReplayer::DeferredRayTracingInfo>_>
    ::~_Vector_base((_Vector_base<ThreadedReplayer::DeferredRayTracingInfo,_std::allocator<ThreadedReplayer::DeferredRayTracingInfo>_>
                     *)((long)&this->deferred_raytracing[3].
                               super__Vector_base<ThreadedReplayer::DeferredRayTracingInfo,_std::allocator<ThreadedReplayer::DeferredRayTracingInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x60);
  lVar1 = 0;
  do {
    std::
    _Vector_base<ThreadedReplayer::DeferredComputeInfo,_std::allocator<ThreadedReplayer::DeferredComputeInfo>_>
    ::~_Vector_base((_Vector_base<ThreadedReplayer::DeferredComputeInfo,_std::allocator<ThreadedReplayer::DeferredComputeInfo>_>
                     *)((long)&this->deferred_compute[3].
                               super__Vector_base<ThreadedReplayer::DeferredComputeInfo,_std::allocator<ThreadedReplayer::DeferredComputeInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x60);
  lVar1 = 0;
  do {
    std::
    _Vector_base<ThreadedReplayer::DeferredGraphicsInfo,_std::allocator<ThreadedReplayer::DeferredGraphicsInfo>_>
    ::~_Vector_base((_Vector_base<ThreadedReplayer::DeferredGraphicsInfo,_std::allocator<ThreadedReplayer::DeferredGraphicsInfo>_>
                     *)((long)&this->deferred_graphics[3].
                               super__Vector_base<ThreadedReplayer::DeferredGraphicsInfo,_std::allocator<ThreadedReplayer::DeferredGraphicsInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x60);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_ThreadedReplayer::DeferredRayTracingInfo>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredRayTracingInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->raytracing_parents)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->compute_parents)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_ThreadedReplayer::DeferredGraphicsInfo>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredGraphicsInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->graphics_parents)._M_h);
  lVar1 = 0;
  do {
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)((long)&this->cached_blobs[9]._M_h._M_buckets + lVar1));
    lVar1 = lVar1 + -0x38;
  } while (lVar1 != -0x230);
  std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ::~unique_ptr(&this->replayer_cache_db);
  std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ::~unique_ptr(&this->module_identifier_db);
  lVar1 = 0;
  do {
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)((long)&this->implicit_whitelist[9]._M_h._M_buckets + lVar1));
    lVar1 = lVar1 + -0x38;
  } while (lVar1 != -0x230);
  std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ::~unique_ptr(&this->validation_blacklist_db);
  std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ::~unique_ptr(&this->validation_whitelist_db);
  std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ::~unique_ptr(&this->pipeline_stats_db);
  std::_Deque_base<PipelineWorkItem,_std::allocator<PipelineWorkItem>_>::~_Deque_base
            ((_Deque_base<PipelineWorkItem,_std::allocator<PipelineWorkItem>_> *)
             &this->pipeline_work_queue);
  std::
  _Vector_base<ThreadedReplayer::PerThreadData,_std::allocator<ThreadedReplayer::PerThreadData>_>::
  ~_Vector_base(&(this->per_thread_data).
                 super__Vector_base<ThreadedReplayer::PerThreadData,_std::allocator<ThreadedReplayer::PerThreadData>_>
               );
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->thread_pool);
  lVar1 = 0;
  do {
    std::condition_variable::~condition_variable((condition_variable *)(&this->field_0x530 + lVar1))
    ;
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0xc0);
  std::condition_variable::~condition_variable(&this->work_available_condition);
  std::
  _Hashtable<VkShaderModule_T_*,_VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>,_std::__detail::_Identity,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->enqueued_shader_modules)._M_h);
  std::
  _Hashtable<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_long>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->shader_module_to_hash)._M_h);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->masked_shader_modules)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->raytracing_pipelines)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->graphics_pipelines)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->compute_pipelines)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkRenderPass_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkRenderPass_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->render_passes)._M_h);
  Fossilize::ObjectCache<VkShaderModule_T_*>::~ObjectCache(&this->shader_modules);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->pipeline_layouts)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->layouts)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkSampler_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->samplers)._M_h);
  Options::~Options(&this->opts);
  return;
}

Assistant:

~ThreadedReplayer()
	{
		tear_down_threads();
		flush_pipeline_cache();
		flush_validation_cache();

		for (auto &sampler : samplers)
			if (sampler.second)
				vkDestroySampler(device->get_device(), sampler.second, nullptr);
		for (auto &layout : layouts)
			if (layout.second)
				vkDestroyDescriptorSetLayout(device->get_device(), layout.second, nullptr);
		for (auto &pipeline_layout : pipeline_layouts)
			if (pipeline_layout.second)
				vkDestroyPipelineLayout(device->get_device(), pipeline_layout.second, nullptr);
		for (auto &render_pass : render_passes)
			if (render_pass.second)
				vkDestroyRenderPass(device->get_device(), render_pass.second, nullptr);

		free_pipelines();

		shader_modules.delete_cache([this](Hash, VkShaderModule module) {
			if (module != VK_NULL_HANDLE)
				vkDestroyShaderModule(device->get_device(), module, nullptr);
		});
	}